

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O2

double spmpar(int *i)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  
  iVar2 = *i;
  if (1 < iVar2) {
    iVar1 = ipmpar(&spmpar::K1);
    if (iVar2 == 2) {
      dVar3 = (double)iVar1;
      spmpar::b = dVar3;
      iVar2 = ipmpar(&spmpar::K3);
      spmpar::one = 1.0;
      spmpar::binv = 1.0 / dVar3;
      spmpar::w = pow(dVar3,(double)(iVar2 + 2));
      dVar4 = spmpar::w * spmpar::binv;
      dVar3 = spmpar::binv;
    }
    else {
      iVar2 = ipmpar(&spmpar::K2);
      spmpar::emax = ipmpar(&spmpar::K4);
      spmpar::b = (double)iVar1;
      spmpar::bm1 = (double)(iVar1 + -1);
      spmpar::one = 1.0;
      dVar3 = pow(spmpar::b,(double)(iVar2 + -1));
      spmpar::w = ((dVar3 - spmpar::one) * spmpar::b + spmpar::bm1) / (dVar3 * spmpar::b);
      dVar4 = pow(spmpar::b,(double)(spmpar::emax + -2));
      dVar4 = dVar4 * spmpar::w;
      dVar3 = spmpar::b;
    }
    return dVar4 * dVar3 * dVar3;
  }
  iVar2 = ipmpar(&spmpar::K1);
  spmpar::b = (double)iVar2;
  iVar1 = ipmpar(&spmpar::K2);
  dVar3 = pow((double)iVar2,(double)(1 - iVar1));
  return dVar3;
}

Assistant:

double spmpar(int *i)
/*
-----------------------------------------------------------------------

     SPMPAR PROVIDES THE SINGLE PRECISION MACHINE CONSTANTS FOR
     THE COMPUTER BEING USED. IT IS ASSUMED THAT THE ARGUMENT
     I IS AN INTEGER HAVING ONE OF THE VALUES 1, 2, OR 3. IF THE
     SINGLE PRECISION ARITHMETIC BEING USED HAS M BASE B DIGITS AND
     ITS SMALLEST AND LARGEST EXPONENTS ARE EMIN AND EMAX, THEN

        SPMPAR(1) = B**(1 - M), THE MACHINE PRECISION,

        SPMPAR(2) = B**(EMIN - 1), THE SMALLEST MAGNITUDE,

        SPMPAR(3) = B**EMAX*(1 - B**(-M)), THE LARGEST MAGNITUDE.

-----------------------------------------------------------------------
     WRITTEN BY
        ALFRED H. MORRIS, JR.
        NAVAL SURFACE WARFARE CENTER
        DAHLGREN VIRGINIA
-----------------------------------------------------------------------
-----------------------------------------------------------------------
     MODIFIED BY BARRY W. BROWN TO RETURN DOUBLE PRECISION MACHINE
     CONSTANTS FOR THE COMPUTER BEING USED.  THIS MODIFICATION WAS
     MADE AS PART OF CONVERTING BRATIO TO DOUBLE PRECISION
-----------------------------------------------------------------------
*/
{
static int K1 = 4;
static int K2 = 8;
static int K3 = 9;
static int K4 = 10;
static double spmpar,b,binv,bm1,one,w,z;
static int emax,emin,ibeta,m;
/*
     ..
     .. Executable Statements ..
*/
    if(*i > 1) goto S10;
    b = ipmpar(&K1);
    m = ipmpar(&K2);
    spmpar = pow(b,(double)(1-m));
    return spmpar;
S10:
    if(*i > 2) goto S20;
    b = ipmpar(&K1);
    emin = ipmpar(&K3);
    one = 1.0;
    binv = one/b;
    w = pow(b,(double)(emin+2));
    spmpar = w*binv*binv*binv;
    return spmpar;
S20:
    ibeta = ipmpar(&K1);
    m = ipmpar(&K2);
    emax = ipmpar(&K4);
    b = ibeta;
    bm1 = ibeta-1;
    one = 1.0;
    z = pow(b,(double)(m-1));
    w = ((z-one)*b+bm1)/(b*z);
    z = pow(b,(double)(emax-2));
    spmpar = w*z*b*b;
    return spmpar;
}